

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O1

wchar_t sftp_cmd_open(sftp_command *cmd)

{
  uint uVar1;
  wchar_t wVar2;
  wchar_t in_EDX;
  wchar_t extraout_EDX;
  char *pcVar3;
  
  if (backend == (Backend *)0x0) {
    if (1 < cmd->nwords) {
      pcVar3 = (char *)0x0;
      if (cmd->nwords != 2) {
        uVar1 = atoi(cmd->words[2]);
        pcVar3 = (char *)(ulong)uVar1;
        in_EDX = extraout_EDX;
        if (uVar1 == 0) {
          pcVar3 = "open: invalid port number";
          goto LAB_00112fb2;
        }
      }
      wVar2 = psftp_connect(cmd->words[1],pcVar3,in_EDX);
      if (wVar2 != L'\0') {
        backend = (Backend *)0x0;
        return L'\xffffffff';
      }
      do_sftp_init();
      return L'\x01';
    }
    pcVar3 = "open: expects a host name";
  }
  else {
    pcVar3 = "psftp: already connected";
  }
LAB_00112fb2:
  puts(pcVar3);
  return L'\0';
}

Assistant:

static int sftp_cmd_open(struct sftp_command *cmd)
{
    int portnumber;

    if (backend) {
        printf("psftp: already connected\n");
        return 0;
    }

    if (cmd->nwords < 2) {
        printf("open: expects a host name\n");
        return 0;
    }

    if (cmd->nwords > 2) {
        portnumber = atoi(cmd->words[2]);
        if (portnumber == 0) {
            printf("open: invalid port number\n");
            return 0;
        }
    } else
        portnumber = 0;

    if (psftp_connect(cmd->words[1], NULL, portnumber)) {
        backend = NULL;                /* connection is already closed */
        return -1;                     /* this is fatal */
    }
    do_sftp_init();
    return 1;
}